

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void reset_game(tgestate_t *state)

{
  long in_RDI;
  tgestate_t *unaff_retaddr;
  item_t item;
  int iters;
  tgestate_t *in_stack_00000020;
  undefined4 local_c;
  
  local_c = 0x10;
  do {
    item_discovered(unaff_retaddr,(item_t)((ulong)in_RDI >> 0x38));
    local_c = local_c + -1;
  } while (local_c != 0);
  *(long *)(in_RDI + 0x2b0) = in_RDI + 0x29a;
  reset_map_and_characters(in_stack_00000020);
  *(undefined1 *)(in_RDI + 0x3c1) = 0;
  memset((void *)(in_RDI + 0x6e9),0,5);
  *(undefined1 *)(in_RDI + 0x6ee) = 0;
  *(undefined1 *)(in_RDI + 0x6ef) = 0;
  *(undefined1 *)(in_RDI + 0x6f0) = 0;
  *(undefined1 *)(in_RDI + 0x6f1) = 0;
  *(undefined1 *)(in_RDI + 0x6f2) = 0;
  *(undefined1 *)(in_RDI + 0x6f3) = 0x70;
  plot_score(unaff_retaddr);
  *(undefined1 *)(in_RDI + 0x6e4) = 0xff;
  *(undefined1 *)(in_RDI + 0x6e5) = 0xff;
  draw_all_items((tgestate_t *)0x10b11e);
  *(undefined8 *)(in_RDI + 1000) = 0x1237e0;
  *(undefined1 *)(in_RDI + 0x120) = 2;
  hero_sleeps((tgestate_t *)0x10b14b);
  *(undefined1 *)(in_RDI + 0x750) = 0xff;
  *(undefined2 *)(in_RDI + 0x128) = 0x3e;
  *(undefined2 *)(in_RDI + 0x12a) = 0x23;
  *(undefined2 *)(in_RDI + 300) = 0x10;
  *(undefined2 *)(in_RDI + 0x140) = 0x37;
  *(undefined2 *)(in_RDI + 0x142) = 0x36;
  *(undefined2 *)(in_RDI + 0x144) = 0xe;
  *(undefined2 *)(in_RDI + 0x158) = 0x3e;
  *(undefined2 *)(in_RDI + 0x15a) = 0x23;
  *(undefined2 *)(in_RDI + 0x15c) = 0x10;
  enter_room((tgestate_t *)0x10b1df);
  return;
}

Assistant:

void reset_game(tgestate_t *state)
{
  int    iters; /* was B */
  item_t item;  /* was C */

  assert(state != NULL);

  /* Cause discovery of all items. */
  iters = item__LIMIT;
  item = 0;
  do
    item_discovered(state, item++);
  while (--iters);

  /* Reset message queue. */
  state->messages.queue_pointer = &state->messages.queue[2];
  reset_map_and_characters(state);
  state->vischars[0].flags = 0;

  /* Reset score. */
  memset(&state->score_digits[0], 0, 5);

  state->hero_in_breakfast        = 0;
  state->red_flag                 = 0;
  state->automatic_player_counter = 0;
  state->in_solitary              = 0;
  state->morale_exhausted         = 0;

  /* Reset morale. */
  state->morale = morale_MAX;
  plot_score(state);

  /* Reset and redraw items. */
  state->items_held[0] = item_NONE;
  state->items_held[1] = item_NONE;
  draw_all_items(state);

  /* Reset the hero's sprite. */
  state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];

  /* Put the hero to bed. */
  state->room_index = room_2_HUT2LEFT;
  hero_sleeps(state);

  /* BUG FIX: Reset bribed character index. */
  state->bribed_character = character_NONE;

  /* BUG FIX: Reset position of stoves and crate. */
  state->movable_items[0].mappos.u = 62;
  state->movable_items[0].mappos.v = 35;
  state->movable_items[0].mappos.w = 16;
  state->movable_items[1].mappos.u = 55;
  state->movable_items[1].mappos.v = 54;
  state->movable_items[1].mappos.w = 14;
  state->movable_items[2].mappos.u = 62;
  state->movable_items[2].mappos.v = 35;
  state->movable_items[2].mappos.w = 16;

  enter_room(state); // returns by goto main_loop
  NEVER_RETURNS;
}